

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86IMUL(uchar *stream,x86Reg dst,x86Reg src)

{
  uchar uVar1;
  uint uVar2;
  uchar *puVar3;
  uchar *start;
  x86Reg src_local;
  x86Reg dst_local;
  uchar *stream_local;
  
  uVar2 = encodeRex(stream,false,src,dst);
  puVar3 = stream + uVar2;
  *puVar3 = '\x0f';
  puVar3[1] = 0xaf;
  uVar1 = encodeRegister(src,regCode[dst]);
  puVar3[2] = uVar1;
  return ((int)puVar3 + 3) - (int)stream;
}

Assistant:

int x86IMUL(unsigned char *stream, x86Reg dst, x86Reg src)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, false, src, dst);
	*stream++ = 0x0f;
	*stream++ = 0xaf;
	*stream++ = encodeRegister(src, regCode[dst]);

	return int(stream - start);
}